

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall
Node::OutputArrayParam_abi_cxx11_(string *__return_storage_ptr__,Node *this,int Increment)

{
  int iVar1;
  string *this_00;
  char buffer [16];
  string local_40;
  
  this_00 = (string *)buffer;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x1f5) {
    if (this->Tree[0] == (Node *)0x0) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      OutputArrayParam_abi_cxx11_((string *)buffer,this->Tree[0],Increment);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->Tree[1] == (Node *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    OutputArrayParam_abi_cxx11_((string *)buffer,this->Tree[1],Increment);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_00 = (string *)buffer;
  }
  else if (Increment == 1) {
    iVar1 = IsSimpleInteger(this);
    if (iVar1 != 0) {
      iVar1 = atoi((this->TextValue)._M_dataplus._M_p);
      sprintf(buffer,"%d",(ulong)(iVar1 + 1));
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    OutputForcedType_abi_cxx11_(&local_40,this,VARTYPE_INTEGER);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                   &local_40," + 1");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
    this_00 = &local_40;
  }
  else {
    OutputForcedType_abi_cxx11_((string *)buffer,this,VARTYPE_INTEGER);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputArrayParam(
	int Increment	/**< Increment */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_N_LIST:

		if (Tree[0] != 0)
		{
			result = Tree[0]->OutputArrayParam(Increment);
		}
		else
		{
			result = "(NULL)";
		}
		result += "][";
		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputArrayParam(Increment);
		}
		else
		{
			result += "(NULL)";
		}
		break;

	default:

		if (Increment == 1)
		{
			if (IsSimpleInteger())
			{
				// FIXME: There really ought to be a better way
				char buffer[16];
				sprintf(buffer, "%d", atoi(TextValue.c_str()) + 1);
				result = buffer;
			}
			else
			{
				result = OutputForcedType(VARTYPE_INTEGER) + " + 1";
			}
		}
		else
		{
			result = OutputForcedType(VARTYPE_INTEGER);
		}
		break;

	}
	return result;
}